

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpulseGenerator.cpp
# Opt level: O0

int ImpulseGenerator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  float fVar2;
  EffectData *pEVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_5c;
  int local_54;
  int i;
  float s;
  float noise;
  float decaytime;
  uint n;
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar3 = UnityAudioEffectState::GetEffectData<ImpulseGenerator::EffectData>(state);
  if ((((state->field_0).field_0.flags & 1) == 0) || (((state->field_0).field_0.flags & 6) != 0)) {
    memset(outbuffer,0,(ulong)length * 4 * (long)outchannels);
  }
  else {
    _inchannels_local = outbuffer;
    outbuffer_local = inbuffer;
    for (noise = 0.0; (uint)noise < length; noise = (float)((int)noise + 1)) {
      (pEVar3->field_0).data.samplesleft = (pEVar3->field_0).data.samplesleft - 1.0;
      if ((pEVar3->field_0).data.samplesleft <= 0.0) {
        fVar5 = (pEVar3->field_0).data.p[4];
        fVar4 = Random::GetFloat(&(pEVar3->field_0).data.random,0.0,(pEVar3->field_0).data.p[5]);
        fVar5 = fVar5 + fVar4;
        if (0.0 < fVar5) {
          local_5c = powf(0.001,1000.0 / ((float)(state->field_0).field_0.samplerate * fVar5));
        }
        else {
          local_5c = 0.0;
        }
        (pEVar3->field_0).data.decay = local_5c;
        fVar5 = (pEVar3->field_0).data.p[2];
        fVar4 = Random::GetFloat(&(pEVar3->field_0).data.random,0.0,(pEVar3->field_0).data.p[3]);
        (pEVar3->field_0).data.level = fVar5 + fVar4;
        fVar5 = (pEVar3->field_0).data.samplesleft;
        fVar4 = (pEVar3->field_0).data.p[0];
        fVar6 = Random::GetFloat(&(pEVar3->field_0).data.random,0.0,(pEVar3->field_0).data.p[1]);
        fVar5 = FastMax(0.0,(fVar4 + fVar6) * 0.001 * (float)(state->field_0).field_0.samplerate +
                            fVar5);
        (pEVar3->field_0).data.samplesleft = fVar5;
      }
      fVar7 = Random::GetFloat(&(pEVar3->field_0).data.random,-1.0,1.0);
      fVar5 = (pEVar3->field_0).data.p[6];
      fVar4 = (pEVar3->field_0).data.level;
      fVar6 = (pEVar3->field_0).data.p[7];
      fVar1 = (pEVar3->field_0).data.level;
      fVar2 = (pEVar3->field_0).data.level;
      for (local_54 = 0; local_54 < outchannels; local_54 = local_54 + 1) {
        _inchannels_local[local_54] =
             outbuffer_local[local_54] + fVar6 * (fVar7 * fVar1 + -fVar2) + fVar7 * fVar5 + fVar4;
      }
      outbuffer_local = outbuffer_local + inchannels;
      _inchannels_local = _inchannels_local + outchannels;
      (pEVar3->field_0).data.level = (pEVar3->field_0).data.decay * (pEVar3->field_0).data.level;
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        if ((state->flags & UnityAudioEffectStateFlags_IsPlaying) == 0 || (state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused)) != 0)
        {
            memset(outbuffer, 0, sizeof(float) * length * outchannels);
            return UNITY_AUDIODSP_OK;
        }

        for (unsigned int n = 0; n < length; n++)
        {
            data->samplesleft -= 1.0f;
            if (data->samplesleft <= 0.0f)
            {
                float decaytime = data->p[P_BASEDECAY] + data->random.GetFloat(0.0f, data->p[P_RANDOMDECAY]);
                data->decay = (decaytime <= 0.0f) ? 0.0f : powf(0.001f, 1000.0f / (state->samplerate * decaytime));
                data->level = data->p[P_BASEAMP] + data->random.GetFloat(0.0f, data->p[P_RANDOMAMP]);
                data->samplesleft = FastMax(0.0f, data->samplesleft + (data->p[P_BASEPERIOD] + data->random.GetFloat(0.0f, data->p[P_RANDOMPERIOD])) * 0.001f * state->samplerate);
            }
            float noise = data->random.GetFloat(-1.0f, 1.0f);
            float s = noise * data->p[P_NOISEADD] + data->level + data->p[P_NOISEMIX] * (noise * data->level - data->level);
            for (int i = 0; i < outchannels; i++)
                outbuffer[i] = inbuffer[i] + s;
            inbuffer += inchannels;
            outbuffer += outchannels;
            data->level *= data->decay;
        }

        return UNITY_AUDIODSP_OK;
    }